

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_9703::MemoryMappedFileTest_DoubleMap_Test::TestBody
          (MemoryMappedFileTest_DoubleMap_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  regex_t *prVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  long *plVar6;
  size_t sVar7;
  char *pcVar8;
  long *plVar9;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar10;
  StringRef data;
  StringRef data_00;
  File file2;
  File file1;
  MemoryMappedFile<fmt::File> f;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  string filename1;
  string filename2;
  File FStack_138;
  File local_134;
  AssertHelper local_130;
  MemoryMappedFileBase local_128;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  CStringRef local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  RE local_c0;
  
  (anonymous_namespace)::GetExecutableDir_abi_cxx11_();
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_c0);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_d0 = *plVar9;
    lStack_c8 = plVar6[3];
    local_e0.data_ = (char *)&local_d0;
  }
  else {
    local_d0 = *plVar9;
    local_e0.data_ = (char *)*plVar6;
  }
  local_d8 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  prVar2 = &local_c0.full_regex_;
  if ((regex_t *)local_c0.pattern_ != prVar2) {
    operator_delete(local_c0.pattern_,(ulong)(local_c0.full_regex_.buffer + 1));
  }
  data.size_ = 3;
  data.data_ = "abc";
  WriteFile(local_e0,data);
  local_128.start_ = (char *)0x0;
  local_128.size_ = 0;
  fmt::File::File(&local_134,local_e0,0);
  sVar7 = fmt::File::size(&local_134);
  mp::MemoryMappedFile<fmt::File>::map((MemoryMappedFile<fmt::File> *)&local_128,&local_134,sVar7);
  (anonymous_namespace)::GetExecutableDir_abi_cxx11_();
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_100);
  plVar9 = plVar6 + 2;
  if ((regex_t *)*plVar6 == (regex_t *)plVar9) {
    local_c0.full_regex_.buffer = (re_dfa_t *)*plVar9;
    local_c0.full_regex_.allocated = plVar6[3];
    local_c0.pattern_ = (char *)prVar2;
  }
  else {
    local_c0.full_regex_.buffer = (re_dfa_t *)*plVar9;
    local_c0.pattern_ = (char *)*plVar6;
  }
  local_c0._8_8_ = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  paVar1 = &local_100.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar1) {
    operator_delete(local_100._M_dataplus._M_p,
                    CONCAT44(local_100.field_2._M_allocated_capacity._4_4_,
                             local_100.field_2._M_allocated_capacity._0_4_) + 1);
  }
  data_00.size_ = 4;
  data_00.data_ = "defg";
  WriteFile((CStringRef)local_c0.pattern_,data_00);
  fmt::File::File(&FStack_138,(CStringRef)local_c0.pattern_,0);
  sVar7 = fmt::File::size(&FStack_138);
  mp::MemoryMappedFile<fmt::File>::map((MemoryMappedFile<fmt::File> *)&local_128,&FStack_138,sVar7);
  local_100._M_dataplus._M_p = (pointer)paVar1;
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128.start_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::__throw_logic_error("basic_string::_M_construct null not valid");
  }
  local_100.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)local_128.start_;
  local_100._M_string_length = (size_type)&DAT_00000004;
  local_100.field_2._M_allocated_capacity._4_4_ =
       local_100.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_110,"\"defg\"","std::string(f.start(), 4)",(char (*) [5])"defg",
             &local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar1) {
    operator_delete(local_100._M_dataplus._M_p,
                    CONCAT44(local_100.field_2._M_allocated_capacity._4_4_,
                             local_100.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_110.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_108.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_108.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/os-test.cc",0x106,
               pcVar8);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) && (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_100._M_dataplus._M_p + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_108,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_130.data_._0_4_ = 4;
  local_110.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_100,"4u","f.size()",(uint *)&local_130,(unsigned_long *)&local_110);
  if ((char)local_100._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_110);
    if ((undefined8 *)local_100._M_string_length == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_100._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/os-test.cc",0x107,
               pcVar8);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (((local_110.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_110.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_110.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_100._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  fmt::File::~File(&FStack_138);
  if ((regex_t *)local_c0.pattern_ != prVar2) {
    operator_delete(local_c0.pattern_,(ulong)(local_c0.full_regex_.buffer + 1));
  }
  fmt::File::~File(&local_134);
  mp::internal::MemoryMappedFileBase::~MemoryMappedFileBase(&local_128);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::RE::Init(&local_c0,"");
    bVar3 = testing::internal::DeathTest::Create
                      ("(void)*start",&local_c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/os-test.cc"
                       ,0x109,(DeathTest **)&local_128);
    sVar10.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_128.start_;
    if (bVar3) {
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_128.start_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        local_110.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_128.start_;
        iVar5 = (**(code **)(*(long *)local_128.start_ + 0x10))(local_128.start_);
        pcVar8 = local_128.start_;
        if (iVar5 == 0) {
          iVar5 = (**(code **)(*(long *)local_128.start_ + 0x18))(local_128.start_);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          cVar4 = (**(code **)(*(long *)pcVar8 + 0x20))(pcVar8,bVar3);
        }
        else {
          cVar4 = '\x01';
          if (iVar5 == 1) {
            testing::internal::AlwaysTrue();
            (**(code **)(*(long *)local_128.start_ + 0x28))(local_128.start_,2);
            (**(code **)(*(long *)pcVar8 + 0x28))(pcVar8,0);
            sVar10.ptr_ = local_110.ptr_;
            if (local_110.ptr_ ==
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
            goto LAB_001111f5;
          }
        }
        bVar3 = testing::internal::IsTrue(true);
        if (bVar3) {
          (**(code **)(*(long *)sVar10.ptr_ + 8))(sVar10.ptr_);
        }
        if (cVar4 == '\0') goto LAB_00111201;
      }
LAB_001111f5:
      testing::internal::RE::~RE(&local_c0);
      goto LAB_00111277;
    }
LAB_00111201:
    testing::internal::RE::~RE(&local_c0);
  }
  testing::Message::Message((Message *)&local_c0);
  pcVar8 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_100,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/os-test.cc",0x109,
             pcVar8);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_c0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
  if ((((long *)local_c0.pattern_ != (long *)0x0) &&
      (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
     ((long *)local_c0.pattern_ != (long *)0x0)) {
    (**(code **)(*(long *)local_c0.pattern_ + 8))();
  }
LAB_00111277:
  if ((long *)local_e0.data_ != &local_d0) {
    operator_delete(local_e0.data_,local_d0 + 1);
  }
  return;
}

Assistant:

TEST(MemoryMappedFileTest, DoubleMap) {
  std::string filename1 = GetExecutableDir() + "/test1";
  WriteFile(filename1, "abc");
  const volatile char *start = 0;
  {
    MemoryMappedFile<> f;
    File file1(filename1, File::RDONLY);
    f.map(file1, static_cast<std::size_t>(file1.size()));
    std::string filename2 = GetExecutableDir() + "/test2";
    WriteFile(filename2, "defg");
    File file2(filename2, File::RDONLY);
    f.map(file2, static_cast<std::size_t>(file2.size()));
    start = f.start();
    EXPECT_EQ("defg", std::string(f.start(), 4));
    EXPECT_EQ(4u, f.size());
  }
  EXPECT_DEATH((void)*start, "");
}